

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexOrdering.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderVertexOrdering::verifyVertexOrderingCorrectness
          (TessellationShaderVertexOrdering *this,_test_iteration *test_iteration)

{
  float *pfVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  TestError *pTVar3;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  ulong uVar4;
  ulong extraout_RDX;
  char *local_288;
  char *local_280;
  MessageBuilder local_278;
  undefined1 local_e8 [8];
  string vertex_ordering;
  string primitive_mode;
  int i_op_1;
  uint n_vertex_1;
  float determinant;
  uint n_vertex;
  float barycentric_vertex_data [9];
  float local_68 [2];
  float cartesian_vertex_data [6];
  float *primitive_vertex3_data;
  float *primitive_vertex2_data;
  float *primitive_vertex1_data;
  float *primitive_data;
  uint n_primitive;
  uint n_vertices_per_primitive;
  float epsilon;
  _test_iteration *test_iteration_local;
  TessellationShaderVertexOrdering *this_local;
  
  primitive_data._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)test_iteration->n_vertices % 3;
    if (test_iteration->n_vertices / 3 <= primitive_data._4_4_) {
      return;
    }
    pfVar1 = (float *)(test_iteration->data + (ulong)(primitive_data._4_4_ * 9) * 4);
    local_68[0] = *pfVar1;
    local_68[1] = pfVar1[1];
    cartesian_vertex_data[0] = pfVar1[3];
    cartesian_vertex_data[1] = pfVar1[4];
    cartesian_vertex_data[2] = pfVar1[6];
    cartesian_vertex_data[3] = pfVar1[7];
    if (test_iteration->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
      determinant = *pfVar1;
      n_vertex = (uint)pfVar1[1];
      barycentric_vertex_data[0] = pfVar1[2];
      barycentric_vertex_data[1] = pfVar1[3];
      barycentric_vertex_data[2] = pfVar1[4];
      barycentric_vertex_data[3] = pfVar1[5];
      barycentric_vertex_data[4] = pfVar1[6];
      barycentric_vertex_data[5] = pfVar1[7];
      barycentric_vertex_data[6] = pfVar1[8];
      for (n_vertex_1 = 0; n_vertex_1 < 3; n_vertex_1 = n_vertex_1 + 1) {
        TessellationShaderUtils::convertBarycentricCoordinatesToCartesian
                  (&determinant + n_vertex_1 * 3,local_68 + (n_vertex_1 << 1));
        uVar4 = extraout_RDX;
      }
    }
    i_op_1 = 0;
    for (primitive_mode.field_2._12_4_ = 0; (uint)primitive_mode.field_2._12_4_ < 3;
        primitive_mode.field_2._12_4_ = primitive_mode.field_2._12_4_ + 1) {
      uVar4 = (ulong)(primitive_mode.field_2._12_4_ + 1) % 3;
      i_op_1 = (int)(local_68[(uint)(primitive_mode.field_2._12_4_ << 1)] *
                     local_68[(int)uVar4 * 2 + 1] +
                     -(local_68[(int)uVar4 << 1] * local_68[primitive_mode.field_2._12_4_ * 2 + 1])
                    + (float)i_op_1);
    }
    if ((((test_iteration->vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW) ||
         (test_iteration->vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT)) &&
        ((float)i_op_1 * 0.5 < 0.0)) ||
       ((test_iteration->vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CW &&
        (0.0 <= (float)i_op_1 * 0.5)))) break;
    primitive_data._4_4_ = primitive_data._4_4_ + 1;
  }
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            ((string *)((long)&vertex_ordering.field_2 + 8),
             (TessellationShaderUtils *)(ulong)test_iteration->primitive_mode,
             (_tessellation_primitive_mode)uVar4);
  TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
            ((string *)local_e8,(TessellationShaderUtils *)(ulong)test_iteration->vertex_ordering,
             vertex_ordering_00);
  this_00 = tcu::TestContext::getLog
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_278,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_278,(char (*) [22])"For primitive mode: [");
  local_280 = (char *)std::__cxx11::string::c_str();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_280);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [35])"] and inner tessellation levels: [");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,test_iteration->inner_tess_levels);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,test_iteration->inner_tess_levels + 1);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [35])"] and outer tessellation levels: [");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,test_iteration->outer_tess_levels);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,test_iteration->outer_tess_levels + 1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,test_iteration->outer_tess_levels + 2);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,test_iteration->outer_tess_levels + 3);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a0e7f2);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [23])"and vertex ordering: [");
  local_288 = (char *)std::__cxx11::string::c_str();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_288);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [86])
                             "] , vertex orientation has been found to be incompatible with the ordering requested."
                     );
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_278);
  if ((test_iteration->vertex_ordering != TESSELLATION_SHADER_VERTEX_ORDERING_CCW) &&
     (test_iteration->vertex_ordering != TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT)) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,
               "Clockwise ordering was expected but retrieved tessellation coordinates are laid out in counter-clockwise order"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
               ,0x293);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,
             "Counter-clockwise ordering was expected but retrieved tessellation coordinates are laid out in clockwise order"
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
             ,0x28e);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TessellationShaderVertexOrdering::verifyVertexOrderingCorrectness(const _test_iteration& test_iteration)
{
	/* Sanity check */
	DE_ASSERT(test_iteration.primitive_mode != TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES);

	/* Iterate through all vertices */
	const float		   epsilon					= 1e-5f;
	const unsigned int n_vertices_per_primitive = 3;

	for (unsigned int n_primitive = 0; n_primitive < test_iteration.n_vertices / n_vertices_per_primitive;
		 ++n_primitive)
	{
		const float* primitive_data =
			(const float*)test_iteration.data + 3 /* components */ * n_primitive * n_vertices_per_primitive;
		const float* primitive_vertex1_data = primitive_data;
		const float* primitive_vertex2_data = primitive_vertex1_data + 3; /* components */
		const float* primitive_vertex3_data = primitive_vertex2_data + 3; /* components */

		float cartesian_vertex_data[6] = { primitive_vertex1_data[0], primitive_vertex1_data[1],
										   primitive_vertex2_data[0], primitive_vertex2_data[1],
										   primitive_vertex3_data[0], primitive_vertex3_data[1] };

		if (test_iteration.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
		{
			/* Triangles are described in barycentric coordinate. Convert to
			 * cartesian coordinates before we continue with actual test.
			 */
			const float barycentric_vertex_data[] = {
				primitive_vertex1_data[0], primitive_vertex1_data[1], primitive_vertex1_data[2],
				primitive_vertex2_data[0], primitive_vertex2_data[1], primitive_vertex2_data[2],
				primitive_vertex3_data[0], primitive_vertex3_data[1], primitive_vertex3_data[2],
			};

			/* Sanity checks .. */
			DE_UNREF(epsilon);
			DE_ASSERT(de::abs(barycentric_vertex_data[0] + barycentric_vertex_data[1] + barycentric_vertex_data[2] -
							  1.0f) < epsilon);
			DE_ASSERT(de::abs(barycentric_vertex_data[3] + barycentric_vertex_data[4] + barycentric_vertex_data[5] -
							  1.0f) < epsilon);
			DE_ASSERT(de::abs(barycentric_vertex_data[6] + barycentric_vertex_data[7] + barycentric_vertex_data[8] -
							  1.0f) < epsilon);

			for (unsigned int n_vertex = 0; n_vertex < 3; ++n_vertex)
			{
				TessellationShaderUtils::convertBarycentricCoordinatesToCartesian(
					barycentric_vertex_data + n_vertex * 3, cartesian_vertex_data + n_vertex * 2);
			}
		} /* if (test_iteration.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) */

		/* Compute result of eq 3.6.1 */
		float determinant = 0.0f;

		for (unsigned int n_vertex = 0; n_vertex < n_vertices_per_primitive; ++n_vertex)
		{
			int i_op_1 = (n_vertex + 1) % n_vertices_per_primitive;

			determinant += (cartesian_vertex_data[n_vertex * 2 /* components */ + 0] *
								cartesian_vertex_data[i_op_1 * 2 /* components */ + 1] -
							cartesian_vertex_data[i_op_1 * 2 /* components */ + 0] *
								cartesian_vertex_data[n_vertex * 2 /* components */ + 1]);
		} /* for (all vertices) */

		determinant *= 0.5f;

		/* Positive determinant implies counterclockwise ordering */
		if (((test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
			  test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) &&
			 determinant < 0.0f) ||
			(test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CW && determinant >= 0.0f))
		{
			std::string primitive_mode =
				TessellationShaderUtils::getESTokenForPrimitiveMode(test_iteration.primitive_mode);
			std::string vertex_ordering =
				TessellationShaderUtils::getESTokenForVertexOrderingMode(test_iteration.vertex_ordering);

			m_testCtx.getLog() << tcu::TestLog::Message << "For primitive mode: [" << primitive_mode.c_str()
							   << "] "
								  "and inner tessellation levels:"
								  " ["
							   << test_iteration.inner_tess_levels[0] << ", " << test_iteration.inner_tess_levels[1]
							   << "] "
								  "and outer tessellation levels:"
								  " ["
							   << test_iteration.outer_tess_levels[0] << ", " << test_iteration.outer_tess_levels[1]
							   << ", " << test_iteration.outer_tess_levels[2] << ", "
							   << test_iteration.outer_tess_levels[3] << "] "
							   << "and vertex ordering: [" << vertex_ordering.c_str()
							   << "] "
								  ", vertex orientation has been found to be incompatible with the ordering requested."
							   << tcu::TestLog::EndMessage;

			if (test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
				test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT)
			{
				TCU_FAIL("Counter-clockwise ordering was expected but retrieved tessellation coordinates are laid out "
						 "in clockwise order");
			}
			else
			{
				TCU_FAIL("Clockwise ordering was expected but retrieved tessellation coordinates are laid out in "
						 "counter-clockwise order");
			}
		}
	} /* for (all triangles) */
}